

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O3

int deqp::gles3::Functional::anon_unknown_0::compareImages
              (TestLog *log,ConstPixelBufferAccess *test,ConstPixelBufferAccess *ref,
              PixelBufferAccess *diffMask,int kernelRadius,_func_bool_IVec4_ptr_IVec4_ptr *pixelCmp)

{
  ConstPixelBufferAccess *this;
  ostringstream *poVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int y;
  int z;
  int radius;
  IVec4 cTest;
  IVec4 cRef;
  int local_22c;
  int local_220;
  int local_21c;
  undefined1 local_1d0 [32];
  undefined1 local_1b0 [384];
  
  iVar2 = (test->m_size).m_data[0];
  iVar3 = (test->m_size).m_data[1];
  tcu::clear(diffMask,(Vec4 *)(anonymous_namespace)::MASK_COLOR_OK);
  if (iVar3 < 1) {
    local_22c = -1;
    local_21c = 0;
    local_220 = 0;
  }
  else {
    local_22c = -1;
    this = (ConstPixelBufferAccess *)(local_1d0 + 0x10);
    z = 0;
    local_220 = 0;
    local_21c = 0;
    do {
      if (0 < iVar2) {
        iVar8 = z + kernelRadius;
        iVar9 = z - kernelRadius;
        y = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixelInt((ConstPixelBufferAccess *)local_1b0,(int)ref,y,z)
          ;
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_1d0,(int)test,y,z);
          bVar7 = (*pixelCmp)((IVec4 *)local_1b0,(IVec4 *)local_1d0);
          if (!bVar7) {
            if (((y < kernelRadius || z < kernelRadius) || iVar3 <= iVar8) ||
               (iVar10 = kernelRadius + y, iVar2 <= iVar10)) {
LAB_00634c13:
              tcu::PixelBufferAccess::setPixel
                        (diffMask,(Vec4 *)(anonymous_namespace)::MASK_COLOR_DEV,y,z,0);
              if (local_22c == -1) {
                local_22c = 0;
              }
              local_21c = local_21c + 1;
            }
            else {
              if (iVar9 <= iVar8) {
                bVar5 = 0;
                iVar6 = y - kernelRadius;
                iVar11 = iVar9;
joined_r0x00634b56:
                do {
                  if (iVar6 <= iVar10) {
                    tcu::ConstPixelBufferAccess::getPixelInt(this,(int)test,iVar6,iVar11);
                    bVar7 = (*pixelCmp)((IVec4 *)local_1b0,(IVec4 *)this);
                    if (!bVar7) {
                      iVar6 = iVar6 + 1;
                      goto joined_r0x00634b56;
                    }
                    bVar5 = 1;
                  }
                  iVar11 = iVar11 + 1;
                  iVar6 = y - kernelRadius;
                } while (iVar11 <= iVar8);
                if (iVar9 <= iVar8) {
                  bVar4 = 0;
                  iVar6 = y - kernelRadius;
                  iVar11 = iVar9;
joined_r0x00634bc4:
                  do {
                    if (iVar6 <= iVar10) {
                      tcu::ConstPixelBufferAccess::getPixelInt(this,(int)ref,iVar6,iVar11);
                      bVar7 = (*pixelCmp)((IVec4 *)local_1d0,(IVec4 *)this);
                      if (!bVar7) {
                        iVar6 = iVar6 + 1;
                        goto joined_r0x00634bc4;
                      }
                      bVar4 = 1;
                    }
                    iVar11 = iVar11 + 1;
                    iVar6 = y - kernelRadius;
                  } while (iVar11 <= iVar8);
                  if ((bool)(bVar5 & bVar4)) goto LAB_00634c13;
                }
              }
              tcu::PixelBufferAccess::setPixel
                        (diffMask,(Vec4 *)(anonymous_namespace)::MASK_COLOR_FAIL,y,z,0);
              local_220 = local_220 + 1;
              local_22c = 1;
            }
          }
          y = y + 1;
        } while (y != iVar2);
      }
      z = z + 1;
    } while (z != iVar3);
  }
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::operator<<(poVar1,local_21c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1," deviating pixel(s) found.",0x1a);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::operator<<(poVar1,local_220);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1," faulty pixel(s) found.",0x17);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  if (local_22c != 1) {
    local_220 = local_22c;
  }
  return local_220;
}

Assistant:

inline int compareImages (tcu::TestLog& log, const ConstPixelBufferAccess& test, const ConstPixelBufferAccess& ref, const PixelBufferAccess& diffMask, int kernelRadius, bool (*pixelCmp)(const tcu::IVec4& a, const tcu::IVec4& b))
{
	const int			height				= test.getHeight();
	const int			width				= test.getWidth();
	int					deviatingPixels		= 0;
	int					faultyPixels		= 0;
	int					compareFailed		= -1;

	tcu::clear(diffMask, MASK_COLOR_OK);

	for (int y = 0; y < height; y++)
	{
		for (int x = 0; x < width; x++)
		{
			const tcu::IVec4 cRef	= ref.getPixelInt(x, y);
			const tcu::IVec4 cTest	= test.getPixelInt(x, y);

			// Pixelwise match, no deviation or fault
			if ((*pixelCmp)(cRef, cTest))
				continue;

			// Deviation
			{
				const int radius	= kernelRadius;
				bool foundRef		= false;
				bool foundTest		= false;

				// edges are considered a "deviation" too. The suitable pixel could be "behind" the edge
				if (y < radius || x < radius || y + radius >= height || x + radius >= width)
				{
					foundRef	= true;
					foundTest	= true;
				}
				else
				{
					// find ref
					for (int kY = y - radius; kY <= y + radius; kY++)
					for (int kX = x - radius; kX <= x + radius; kX++)
					{
						if ((*pixelCmp)(cRef, test.getPixelInt(kX, kY)))
						{
							foundRef = true;
							break;
						}
					}

					// find result
					for (int kY = y - radius; kY <= y + radius; kY++)
					for (int kX = x - radius; kX <= x + radius; kX++)
					{
						if ((*pixelCmp)(cTest, ref.getPixelInt(kX, kY)))
						{
							foundTest = true;
							break;
						}
					}
				}

				// A pixel is deviating if the reference color is found inside the kernel and (~= every pixel reference draws must be drawn by the gl too)
				// the result color is found in the reference image inside the kernel         (~= every pixel gl draws must be drawn by the reference too)
				if (foundRef && foundTest)
				{
					diffMask.setPixel(MASK_COLOR_DEV, x, y);
					if (compareFailed == -1)
						compareFailed = 0;
					deviatingPixels++;
					continue;
				}
			}

			diffMask.setPixel(MASK_COLOR_FAIL, x, y);
			faultyPixels++;									// The pixel is faulty if the color is not found
			compareFailed = 1;
		}
	}

	log << TestLog::Message << deviatingPixels	<< " deviating pixel(s) found." << TestLog::EndMessage;
	log << TestLog::Message << faultyPixels		<< " faulty pixel(s) found." << TestLog::EndMessage;

	return (compareFailed == 1 ? faultyPixels : compareFailed);
}